

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O2

bool_t prf_texture_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  ushort uVar1;
  uint uVar2;
  uint len;
  bool_t bVar3;
  
  if (node->opcode == prf_texture_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = node->length;
    if (uVar1 < 0xcc) {
      uVar2 = 4;
    }
    else {
      buffer = node->data;
      bf_write(bfile,buffer,200);
      uVar1 = node->length;
      uVar2 = 0xcc;
      if (0xcf < uVar1) {
        bf_put_int32_be(bfile,*(int32_t *)(buffer + 200));
        uVar1 = node->length;
        uVar2 = 0xd0;
        if (0xd3 < uVar1) {
          bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xcc));
          uVar1 = node->length;
          uVar2 = 0xd4;
          if (0xd7 < uVar1) {
            bf_put_int32_be(bfile,*(int32_t *)(buffer + 0xd0));
            uVar1 = node->length;
            uVar2 = 0xd8;
          }
        }
      }
    }
    bVar3 = 1;
    len = uVar1 - uVar2;
    if (uVar2 <= uVar1 && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar2 - 4),len);
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried using texture save method for node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_texture_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried using texture save method for node of type %d.",
                   node->opcode);
        return FALSE;
    }
    
    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 200) ) break;
        bf_write( bfile, (unsigned char *) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->pattern_index ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->x_location ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->y_location ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                         node->length - pos);
  
    return TRUE;
}